

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

uint get_tmx_tile_id(vector<Tile_*,_std::allocator<Tile_*>_> *tilemap,int index)

{
  pointer ppTVar1;
  Tile *pTVar2;
  ostream *poVar3;
  char *extraout_RAX;
  vector<Tile_*,_std::allocator<Tile_*>_> *in_RCX;
  Tile *pTVar4;
  vector<Tile_*,_std::allocator<Tile_*>_> *tiles;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  Image *input_image;
  char *pcVar10;
  int in_R8D;
  uint uVar11;
  uint uVar12;
  uint uStack_274;
  char *pcStack_258;
  long lStack_250;
  char acStack_248 [16];
  long lStack_238;
  filebuf afStack_230 [240];
  ios_base aiStack_140 [264];
  
  input_image = (Image *)(long)index;
  ppTVar1 = (tilemap->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((Image *)((long)(tilemap->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3) <= input_image) {
    pcVar10 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    std::__cxx11::string::string((string *)&pcStack_258,pcVar10,(allocator *)&lStack_238);
    std::__cxx11::string::append((char *)&pcStack_258);
    write_tiles_to_png_image(pcStack_258,input_image,tiles);
    uVar6 = input_image->width;
    uVar8 = input_image->height;
    std::ofstream::ofstream(&lStack_238);
    std::ofstream::open((char *)&lStack_238,(_Ios_Openmode)pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&lStack_238,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&lStack_238,
               "<map version=\"1.0\" orientation=\"orthogonal\" renderorder=\"right-down\" width=\""
               ,0x4c);
    uVar12 = uVar6 >> 3;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&lStack_238,uVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" height=\"",10);
    uVar9 = uVar8 >> 3;
    std::ostream::operator<<(poVar3,uVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&lStack_238,"\" tilewidth=\"",0xd)
    ;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&lStack_238,8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" tileheight=\"",0xe);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\">\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&lStack_238," <tileset firstgid=\"1\" name=\"tileset\" tilewidth=\"",0x31)
    ;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&lStack_238,8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" tileheight=\"",0xe);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\">\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&lStack_238,"  <image source=\"",0x11);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&lStack_238,pcStack_258,lStack_250);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" />\n",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&lStack_238," </tileset>\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&lStack_238," <layer name=\"Bottom\" width=\"",0x1d);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&lStack_238,uVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" height=\"",10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\">\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&lStack_238,"  <data encoding=\"csv\" >",0x18);
    uVar11 = (uint)((ulong)((long)(in_RCX->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(in_RCX->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start) >> 3);
    if (in_R8D == 0) {
      if (0 < (int)uVar11) {
        uVar6 = 0;
        do {
          get_tmx_tile_id(in_RCX,uVar6);
          std::ostream::_M_insert<unsigned_long>((ulong)&lStack_238);
          if ((int)uVar6 < (int)(uVar11 - 1)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&lStack_238,",",1);
          }
          if (uVar6 % uVar12 == uVar12 - 1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&lStack_238,"\n",1);
          }
          uVar6 = uVar6 + 1;
        } while (uVar11 != uVar6);
      }
    }
    else if ((in_R8D == 1) && (7 < uVar8)) {
      uStack_274 = 0;
      do {
        if (7 < uVar6) {
          uVar8 = uStack_274 & 1 | (uStack_274 >> 1) * uVar12 * 2;
          uVar7 = 0;
          do {
            get_tmx_tile_id(in_RCX,uVar8);
            std::ostream::_M_insert<unsigned_long>((ulong)&lStack_238);
            if ((int)uVar8 < (int)(uVar11 - 1)) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&lStack_238,",",1);
            }
            if ((int)(uVar7 % (ulong)uVar12) == uVar12 - 1) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&lStack_238,"\n",1);
            }
            uVar5 = (int)uVar7 + 1;
            uVar7 = (ulong)uVar5;
            uVar8 = uVar8 + 2;
          } while (uVar12 != uVar5);
        }
        uStack_274 = uStack_274 + 1;
      } while (uStack_274 != uVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&lStack_238,"  </data>\n",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&lStack_238," </layer>\n",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&lStack_238,"</map>\n",7);
    std::ofstream::close();
    lStack_238 = _VTT;
    *(undefined8 *)(afStack_230 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(afStack_230);
    std::ios_base::~ios_base(aiStack_140);
    pcVar10 = acStack_248;
    if (pcStack_258 != pcVar10) {
      operator_delete(pcStack_258);
      pcVar10 = extraout_RAX;
    }
    return (uint)pcVar10;
  }
  pTVar2 = ppTVar1[(long)input_image];
  pTVar4 = pTVar2->original_tile;
  if (pTVar2->original_tile == (Tile *)0x0) {
    pTVar4 = pTVar2;
  }
  return (uint)pTVar2->flipped_y * 0x40000000 +
         ((uint)(byte)~pTVar2->flipped_x << 0x1f | (uint)pTVar4->id) + 0x80000001;
}

Assistant:

unsigned int get_tmx_tile_id(std::vector<Tile *> *tilemap, int index) {
    Tile *t = tilemap->at(index);

    unsigned int id = t->original_tile != NULL ? (unsigned int) t->original_tile->id : (unsigned int) t->id;
    id++;
    if (t->flipped_x) {
        id = id | TMX_FLIP_X_FLAG;
    }
    if (t->flipped_y) {
        id = id | TMX_FLIP_Y_FLAG;
    }

    return id;
}